

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O2

longdouble * __thiscall
BMP::byteSizeCode(longdouble *__return_storage_ptr__,BMP *this,typeOfCode type)

{
  longdouble *in_RAX;
  longdouble *extraout_RAX;
  longdouble *extraout_RAX_00;
  longdouble *extraout_RAX_01;
  GreyCount *pGVar1;
  int iVar2;
  long lVar3;
  GreyCount local_a8;
  
  iVar2 = (int)this;
  if (iVar2 == 0) {
    in_RAX = *(longdouble **)(__return_storage_ptr__ + 0x45);
    pGVar1 = *(GreyCount **)((long)in_RAX + 8);
    for (lVar3 = (long)*(int *)in_RAX << 7; lVar3 != 0; lVar3 = lVar3 + -0x80) {
      bitMap::GreyCount::GreyCount(&local_a8,pGVar1);
      bitMap::GreyCount::~GreyCount(&local_a8);
      pGVar1 = pGVar1 + 1;
      in_RAX = extraout_RAX_01;
    }
  }
  else if (iVar2 == 1) {
    in_RAX = *(longdouble **)(__return_storage_ptr__ + 0x45);
    pGVar1 = *(GreyCount **)((long)in_RAX + 8);
    for (lVar3 = (long)*(int *)in_RAX << 7; lVar3 != 0; lVar3 = lVar3 + -0x80) {
      bitMap::GreyCount::GreyCount(&local_a8,pGVar1);
      bitMap::GreyCount::~GreyCount(&local_a8);
      pGVar1 = pGVar1 + 1;
      in_RAX = extraout_RAX_00;
    }
  }
  else if (iVar2 == 2) {
    in_RAX = *(longdouble **)(__return_storage_ptr__ + 0x45);
    pGVar1 = *(GreyCount **)((long)in_RAX + 8);
    for (lVar3 = (long)*(int *)in_RAX << 7; lVar3 != 0; lVar3 = lVar3 + -0x80) {
      bitMap::GreyCount::GreyCount(&local_a8,pGVar1);
      bitMap::GreyCount::~GreyCount(&local_a8);
      pGVar1 = pGVar1 + 1;
      in_RAX = extraout_RAX;
    }
  }
  return in_RAX;
}

Assistant:

long double BMP::byteSizeCode( typeOfCode type )
{
    using namespace std;
    using namespace bitMap;
    long double temp = 0;

    switch( type ){
        case SHANNON:
            for_each( alphabet->symbol, alphabet->symbol+alphabet->num, [ & ]( GreyCount a ){
                temp += ( a.frq * a.codeShannonFano.size() );
            });
            break;
        case UNIFORM:
            for_each( alphabet->symbol, alphabet->symbol+alphabet->num, [ & ]( GreyCount a ){
                temp += ( a.frq * a.uniformCodes.size() );
            });
            break;
        case HUFFMAN:
            for_each( alphabet->symbol, alphabet->symbol+alphabet->num, [ & ]( GreyCount a ){
                temp += ( a.frq * a.codeHuffman.size() );
            });
            break;
    }
    return temp;
}